

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

int light_get_block_info(light_pcapng pcapng,light_info info_flag,void *info_data,size_t *data_size)

{
  size_t sVar1;
  uint32_t uVar2;
  _light_option *p_Var3;
  
  if (LIGHT_INFO_MAX < info_flag || pcapng == (light_pcapng)0x0) {
    return -3;
  }
  switch(info_flag) {
  case LIGHT_INFO_TYPE:
    if (info_data != (void *)0x0) {
      uVar2 = pcapng->block_type;
LAB_0010333d:
      *(uint32_t *)info_data = uVar2;
    }
    break;
  case LIGHT_INFO_LENGTH:
    if (info_data != (void *)0x0) {
      uVar2 = pcapng->block_total_lenght;
      goto LAB_0010333d;
    }
    break;
  case LIGHT_INFO_BODY:
    if (info_data != (void *)0x0) {
      p_Var3 = (_light_option *)pcapng->block_body;
LAB_0010332b:
      *(_light_option **)info_data = p_Var3;
    }
    goto LAB_0010332e;
  case LIGHT_INFO_OPTIONS:
    if (info_data != (void *)0x0) {
      p_Var3 = pcapng->options;
      goto LAB_0010332b;
    }
LAB_0010332e:
    sVar1 = 8;
    goto LAB_00103344;
  default:
    goto switchD_0010330c_default;
  }
  sVar1 = 4;
LAB_00103344:
  if (data_size != (size_t *)0x0) {
    *data_size = sVar1;
  }
switchD_0010330c_default:
  return 0;
}

Assistant:

int light_get_block_info(const light_pcapng pcapng, light_info info_flag, void *info_data, size_t *data_size)
{
	if (pcapng == NULL || info_flag < 0 || info_flag > LIGHT_INFO_MAX) {
		return LIGHT_INVALID_ARGUMENT;
	}

	switch (info_flag) {
	case LIGHT_INFO_TYPE:
	{
		uint32_t *type = (uint32_t *)info_data;
		if (type)
			*type = pcapng->block_type;
		if (data_size)
			*data_size = sizeof(*type);
		break;
	}
	case LIGHT_INFO_LENGTH:
	{
		uint32_t *length = (uint32_t *)info_data;
		if (length)
			*length = pcapng->block_total_lenght;
		if (data_size)
			*data_size = sizeof(*length);
		break;
	}
	case LIGHT_INFO_BODY:
	{
		uint32_t **body = (uint32_t **)info_data;
		if (body)
			*body = pcapng->block_body;
		if (data_size)
			*data_size = sizeof(*body);
		break;
	}
	case LIGHT_INFO_OPTIONS:
	{
		light_option *body = (light_option *)info_data;
		if (body)
			*body = pcapng->options;
		if (data_size)
			*data_size = sizeof(*body);
		break;
	}
	default:
		break;
	}

	return LIGHT_SUCCESS;
}